

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3_vtab_in(sqlite3_index_info *pIdxInfo,int iCons,int bHandle)

{
  uint local_30;
  u32 m;
  HiddenIndexInfo *pHidden;
  int bHandle_local;
  int iCons_local;
  sqlite3_index_info *pIdxInfo_local;
  
  if (iCons < 0x20) {
    local_30 = 1 << ((byte)iCons & 0x1f);
  }
  else {
    local_30 = 0;
  }
  if ((local_30 & *(uint *)&pIdxInfo[1].field_0x14) == 0) {
    pIdxInfo_local._4_4_ = 0;
  }
  else {
    if (bHandle == 0) {
      *(uint *)&pIdxInfo[1].aOrderBy = (local_30 ^ 0xffffffff) & *(uint *)&pIdxInfo[1].aOrderBy;
    }
    else if (0 < bHandle) {
      *(uint *)&pIdxInfo[1].aOrderBy = local_30 | *(uint *)&pIdxInfo[1].aOrderBy;
    }
    pIdxInfo_local._4_4_ = 1;
  }
  return pIdxInfo_local._4_4_;
}

Assistant:

SQLITE_API int sqlite3_vtab_in(sqlite3_index_info *pIdxInfo, int iCons, int bHandle){
  HiddenIndexInfo *pHidden = (HiddenIndexInfo*)&pIdxInfo[1];
  u32 m = SMASKBIT32(iCons);
  if( m & pHidden->mIn ){
    if( bHandle==0 ){
      pHidden->mHandleIn &= ~m;
    }else if( bHandle>0 ){
      pHidden->mHandleIn |= m;
    }
    return 1;
  }
  return 0;
}